

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O0

void duckdb::alp::AlpCompression<float,_true>::FindBestFactorAndExponent
               (float *input_vector,idx_t n_values,State *state)

{
  bool bVar1;
  uint b;
  uint uVar2;
  reference pAVar3;
  AlpEncodingIndices *in_RDX;
  ulong in_RSI;
  undefined1 auVar4 [16];
  uint64_t estimated_compression_size;
  AlpCombination *combination;
  iterator __end0;
  iterator __begin0;
  vector<duckdb::alp::AlpCombination,_true> *__range3;
  idx_t worse_total_bits_counter;
  uint64_t best_total_bits;
  AlpEncodingIndices best_encoding_indices;
  idx_t i;
  uint idx_increments;
  vector<float,_true> vector_sample;
  vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
  *in_stack_ffffffffffffff58;
  __normal_iterator<duckdb::alp::AlpCombination_*,_std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>_>
  *in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff6c;
  undefined2 in_stack_ffffffffffffff6e;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff70;
  __normal_iterator<duckdb::alp::AlpCombination_*,_std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>_>
  local_78;
  AlpEncodingIndices *local_70;
  long local_68;
  __normal_iterator<duckdb::alp::AlpCombination_*,_std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>_>
  *local_60;
  AlpEncodingIndices local_52;
  ulong local_50;
  undefined4 in_stack_ffffffffffffffc8;
  AlpEncodingIndices in_stack_ffffffffffffffd6;
  
  vector<float,_true>::vector((vector<float,_true> *)0x9f7869);
  auVar4._8_4_ = (int)(in_RSI >> 0x20);
  auVar4._0_8_ = in_RSI;
  auVar4._12_4_ = 0x45300000;
  ceil(((auVar4._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0)) * 0.03125);
  b = ExactNumericCast<unsigned_int>((double)in_stack_ffffffffffffff60);
  uVar2 = MaxValue<unsigned_int>(1,b);
  for (local_50 = 0; local_50 < in_RSI; local_50 = uVar2 + local_50) {
    ::std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff70,
               (value_type_conflict6 *)
               CONCAT26(in_stack_ffffffffffffff6e,CONCAT24(in_stack_ffffffffffffff6c,b)));
  }
  AlpEncodingIndices::AlpEncodingIndices(&local_52,'\0','\0');
  local_60 = (__normal_iterator<duckdb::alp::AlpCombination_*,_std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>_>
              *)NumericLimits<unsigned_long>::Maximum();
  local_68 = 0;
  local_70 = in_RDX + 0x1c0c;
  local_78._M_current =
       (AlpCombination *)
       ::std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>::
       begin(in_stack_ffffffffffffff58);
  ::std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>::end
            (in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff60,
                            (__normal_iterator<duckdb::alp::AlpCombination_*,_std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    pAVar3 = __gnu_cxx::
             __normal_iterator<duckdb::alp::AlpCombination_*,_std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>_>
             ::operator*(&local_78);
    in_stack_ffffffffffffff60 =
         (__normal_iterator<duckdb::alp::AlpCombination_*,_std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>_>
          *)DryCompressToEstimateSize<false>
                      ((vector<float,_true> *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffd6);
    if (in_stack_ffffffffffffff60 < local_60) {
      local_52 = pAVar3->encoding_indices;
      local_68 = 0;
      local_60 = in_stack_ffffffffffffff60;
    }
    else {
      local_68 = local_68 + 1;
      if (local_68 == 2) break;
    }
    __gnu_cxx::
    __normal_iterator<duckdb::alp::AlpCombination_*,_std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>_>
    ::operator++(&local_78);
  }
  *in_RDX = local_52;
  vector<float,_true>::~vector((vector<float,_true> *)0x9f7a3d);
  return;
}

Assistant:

static void FindBestFactorAndExponent(const T *input_vector, idx_t n_values, State &state) {
		//! We sample equidistant values within a vector; to do this we skip a fixed number of values
		vector<T> vector_sample;
		auto idx_increments = MaxValue<uint32_t>(
		    1, ExactNumericCast<uint32_t>(std::ceil((double)n_values / AlpConstants::SAMPLES_PER_VECTOR)));
		for (idx_t i = 0; i < n_values; i += idx_increments) {
			vector_sample.push_back(input_vector[i]);
		}

		AlpEncodingIndices best_encoding_indices = {0, 0};
		uint64_t best_total_bits = NumericLimits<uint64_t>::Maximum();
		idx_t worse_total_bits_counter = 0;

		//! We try each K combination in search for the one which minimize the compression size in the vector
		for (auto &combination : state.best_k_combinations) {
			uint64_t estimated_compression_size =
			    DryCompressToEstimateSize<false>(vector_sample, combination.encoding_indices);

			// If current compression size is worse (higher) or equal than the current best combination
			if (estimated_compression_size >= best_total_bits) {
				worse_total_bits_counter += 1;
				// Early exit strategy
				if (worse_total_bits_counter == AlpConstants::SAMPLING_EARLY_EXIT_THRESHOLD) {
					break;
				}
				continue;
			}
			// Otherwise we replace the best and continue trying with the next combination
			best_total_bits = estimated_compression_size;
			best_encoding_indices = combination.encoding_indices;
			worse_total_bits_counter = 0;
		}
		state.vector_encoding_indices = best_encoding_indices;
	}